

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

_Bool Curl_ossl_data_pending(connectdata *conn,int connindex)

{
  SSL *pSVar1;
  int iVar2;
  
  pSVar1 = (SSL *)conn->ssl[connindex].handle;
  if (pSVar1 != (SSL *)0x0) {
    iVar2 = SSL_pending(pSVar1);
    if (iVar2 != 0) {
      return true;
    }
    pSVar1 = (SSL *)conn->proxy_ssl[connindex].handle;
    if (pSVar1 != (SSL *)0x0) {
      iVar2 = SSL_pending(pSVar1);
      return iVar2 != 0;
    }
  }
  return false;
}

Assistant:

bool Curl_ossl_data_pending(const struct connectdata *conn, int connindex)
{
  if(conn->ssl[connindex].handle)
    /* SSL is in use */
    return (0 != SSL_pending(conn->ssl[connindex].handle) ||
           (conn->proxy_ssl[connindex].handle &&
            0 != SSL_pending(conn->proxy_ssl[connindex].handle))) ?
           TRUE : FALSE;
  else
    return FALSE;
}